

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

void sshcom_derivekey(ptrlen passphrase,uint8_t *keybuf)

{
  ssh_hash *psVar1;
  long *plVar2;
  
  psVar1 = md5_new(&ssh_md5);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_datapl(psVar1->binarysink_,passphrase);
  plVar2 = (long *)(*psVar1->vt->new)();
  (**(code **)(*plVar2 + 0x10))(plVar2,psVar1);
  (**(code **)(*plVar2 + 0x18))(plVar2,keybuf);
  (**(code **)(*plVar2 + 0x20))(plVar2);
  BinarySink_put_data(psVar1->binarysink_,keybuf,0x10);
  (*psVar1->vt->digest)(psVar1,keybuf + 0x10);
  (*psVar1->vt->free)(psVar1);
  return;
}

Assistant:

static void sshcom_derivekey(ptrlen passphrase, uint8_t *keybuf)
{
    /*
     * Derive the encryption key for an ssh.com key file from the
     * passphrase and iv/salt:
     *
     *  - let block A equal MD5(passphrase)
     *  - let block B equal MD5(passphrase || A)
     *  - block C would be MD5(passphrase || A || B) and so on
     *  - encryption key is the first N bytes of A || B
     */
    ssh_hash *h;

    h = ssh_hash_new(&ssh_md5);
    put_datapl(h, passphrase);
    ssh_hash_digest_nondestructive(h, keybuf);
    put_data(h, keybuf, 16);
    ssh_hash_final(h, keybuf + 16);
}